

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MergeReturnPass::ProcessStructuredBlock(MergeReturnPass *this,BasicBlock *block)

{
  pointer pSVar1;
  uint uVar2;
  uint32_t target;
  uint32_t local_24;
  Function *local_20;
  
  BasicBlock::tail((BasicBlock *)&stack0xffffffffffffffe0);
  uVar2 = *(int *)&(local_20->debug_insts_in_header_).
                   super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase -
          0xfd;
  if ((uVar2 < 2) && (this->return_flag_ == (Instruction *)0x0)) {
    AddReturnFlag(this);
  }
  else if (2 < uVar2) {
    return;
  }
  pSVar1 = (this->state_).
           super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar1[-1].break_merge_ != (Instruction *)0x0) {
    target = StructuredControlState::BreakMergeId(pSVar1 + -1);
    BranchToBlock(this,block,target);
    local_24 = BasicBlock::id(block);
    std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&this->return_blocks_,&local_24);
    return;
  }
  __assert_fail("CurrentState().InBreakable() && \"Should be in the placeholder construct.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                ,0xea,"void spvtools::opt::MergeReturnPass::ProcessStructuredBlock(BasicBlock *)");
}

Assistant:

void MergeReturnPass::ProcessStructuredBlock(BasicBlock* block) {
  spv::Op tail_opcode = block->tail()->opcode();
  if (tail_opcode == spv::Op::OpReturn ||
      tail_opcode == spv::Op::OpReturnValue) {
    if (!return_flag_) {
      AddReturnFlag();
    }
  }

  if (tail_opcode == spv::Op::OpReturn ||
      tail_opcode == spv::Op::OpReturnValue ||
      tail_opcode == spv::Op::OpUnreachable) {
    assert(CurrentState().InBreakable() &&
           "Should be in the placeholder construct.");
    BranchToBlock(block, CurrentState().BreakMergeId());
    return_blocks_.insert(block->id());
  }
}